

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

int ERR_clear_last_mark(void)

{
  ERR_STATE *pEVar1;
  bool bVar2;
  int top;
  ERR_STATE *es;
  int local_1c;
  int local_14;
  int local_4;
  
  pEVar1 = ossl_err_get_state_int();
  if (pEVar1 == (ERR_STATE *)0x0) {
    local_4 = 0;
  }
  else {
    local_14 = pEVar1->top;
    while( true ) {
      bVar2 = false;
      if (pEVar1->bottom != local_14) {
        bVar2 = pEVar1->err_marks[local_14] == 0;
      }
      if (!bVar2) break;
      if (local_14 < 1) {
        local_1c = 0xf;
      }
      else {
        local_1c = local_14 + -1;
      }
      local_14 = local_1c;
    }
    if (pEVar1->bottom == local_14) {
      local_4 = 0;
    }
    else {
      pEVar1->err_marks[local_14] = pEVar1->err_marks[local_14] + -1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ERR_clear_last_mark(void)
{
    ERR_STATE *es;
    int top;

    es = ossl_err_get_state_int();
    if (es == NULL)
        return 0;

    top = es->top;
    while (es->bottom != top
           && es->err_marks[top] == 0) {
        top = top > 0 ? top - 1 : ERR_NUM_ERRORS - 1;
    }

    if (es->bottom == top)
        return 0;
    es->err_marks[top]--;
    return 1;
}